

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O0

void GameLoop::startSingle(bool demoMode)

{
  Map *map;
  int numPlayers;
  bool bVar1;
  ostream *poVar2;
  vector<Player_*,_std::allocator<Player_*>_> *pvVar3;
  Deck *this;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar4;
  size_type sVar5;
  GameLoop *pGVar6;
  Deck *gameDeck;
  undefined8 uStack_d0;
  undefined8 local_c8;
  vector<Player_*,_std::allocator<Player_*>_> *local_b8;
  vector<Player_*,_std::allocator<Player_*>_> *gamePlayers;
  AlternativeLoader local_a8;
  AlternativeLoader altLoader;
  undefined1 local_80 [8];
  MapLoader myLoader;
  string local_60 [32];
  Map *local_40;
  Map *gameMap;
  undefined1 local_30 [4];
  int numberOfPlayers;
  string mapToLoad;
  bool demoMode_local;
  
  mapToLoad.field_2._M_local_buf[0xf] = demoMode;
  std::operator<<((ostream *)&std::cout,
                  "____    __    ____  _______  __        ______   ______   .___  ___.  _______    .___________.  ______      .______       __       _______. __  ___  __  \n\\   \\  /  \\  /   / |   ____||  |      /      | /  __  \\  |   \\/   | |   ____|   |           | /  __  \\     |   _  \\     |  |     /       ||  |/  / |  | \n \\   \\/    \\/   /  |  |__   |  |     |  ,----\'|  |  |  | |  \\  /  | |  |__      `---|  |----`|  |  |  |    |  |_)  |    |  |    |   (----`|  \'  /  |  | \n  \\            /   |   __|  |  |     |  |     |  |  |  | |  |\\/|  | |   __|         |  |     |  |  |  |    |      /     |  |     \\   \\    |    <   |  | \n   \\    /\\    /    |  |____ |  `----.|  `----.|  `--\'  | |  |  |  | |  |____        |  |     |  `--\'  |    |  |\\  \\----.|  | .----)   |   |  .  \\  |__| \n    \\__/  \\__/     |_______||_______| \\______| \\______/  |__|  |__| |_______|       |__|      \\______/     | _| `._____||__| |_______/    |__|\\__\\ (__) \n                                                                                                                                                        \n\n"
                 );
  std::__cxx11::string::string((string *)local_30);
  do {
    chooseMap_abi_cxx11_();
    std::__cxx11::string::operator=((string *)local_30,local_60);
    std::__cxx11::string::~string(local_60);
    gameMap._4_4_ = choosePlayerNumber(2,6);
    std::__cxx11::string::string((string *)&altLoader,(string *)local_30);
    MapLoader::MapLoader((MapLoader *)local_80,(string *)&altLoader);
    std::__cxx11::string::~string((string *)&altLoader);
    local_40 = MapLoader::readMapFile((MapLoader *)local_80);
    if (local_40 == (Map *)0x0) {
      AlternativeLoader::AlternativeLoader(&local_a8,(string *)local_30);
      local_40 = AlternativeLoader::altReadMapFile(&local_a8);
      AlternativeLoader::~AlternativeLoader(&local_a8);
    }
    if ((local_40 == (Map *)0x0) || (bVar1 = Map::testConnected(local_40), !bVar1)) {
      std::operator<<((ostream *)&std::cout,
                      "There was an error loading the game board. Try another mapfile.\n");
      gamePlayers._4_4_ = 3;
    }
    else {
      pvVar4 = Map::getMapCountries(local_40);
      sVar5 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::size(pvVar4);
      if ((int)sVar5 < gameMap._4_4_) {
        poVar2 = std::operator<<((ostream *)&std::cout,"The selected map with ");
        pvVar4 = Map::getMapCountries(local_40);
        sVar5 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::size(pvVar4);
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar5);
        poVar2 = std::operator<<(poVar2," cannot support ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,gameMap._4_4_);
        poVar2 = std::operator<<(poVar2," players. Please try again.");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        gamePlayers._4_4_ = 0;
      }
      else {
        gamePlayers._4_4_ = 2;
      }
    }
    MapLoader::~MapLoader((MapLoader *)local_80);
    numPlayers = gameMap._4_4_;
    map = local_40;
  } while ((gamePlayers._4_4_ == 0) || (gamePlayers._4_4_ != 2));
  gameDeck = (Deck *)0x0;
  uStack_d0 = 0;
  local_c8 = 0;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)&gameDeck)
  ;
  pvVar3 = initPlayers(numPlayers,map,(vector<char,_std::allocator<char>_> *)&gameDeck);
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)&gameDeck);
  local_b8 = pvVar3;
  this = (Deck *)operator_new(0x18);
  pvVar4 = Map::getMapCountries(local_40);
  sVar5 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::size(pvVar4);
  Deck::Deck(this,(int)sVar5);
  Deck::createDeck(this);
  Map::printMap(local_40);
  initInstance(local_40,local_b8,this);
  if ((mapToLoad.field_2._M_local_buf[0xf] & 1U) == 0) {
    pGVar6 = getInstance();
    distributeArmies(pGVar6);
    pGVar6 = getInstance();
    loop(pGVar6,-1);
    resetInstance();
  }
  std::operator<<((ostream *)&std::cout,
                  "\n.___________. __    __       ___      .__   __.  __  ___      _______.    _______   ______   .______         .______    __          ___   ____    ____  __  .__   __.   _______  __  \n|           ||  |  |  |     /   \\     |  \\ |  | |  |/  /     /       |   |   ____| /  __  \\  |   _  \\        |   _  \\  |  |        /   \\  \\   \\  /   / |  | |  \\ |  |  /  _____||  | \n`---|  |----`|  |__|  |    /  ^  \\    |   \\|  | |  \'  /     |   (----`   |  |__   |  |  |  | |  |_)  |       |  |_)  | |  |       /  ^  \\  \\   \\/   /  |  | |   \\|  | |  |  __  |  | \n    |  |     |   __   |   /  /_\\  \\   |  . `  | |    <       \\   \\       |   __|  |  |  |  | |      /        |   ___/  |  |      /  /_\\  \\  \\_    _/   |  | |  . `  | |  | |_ | |  | \n    |  |     |  |  |  |  /  _____  \\  |  |\\   | |  .  \\  .----)   |      |  |     |  `--\'  | |  |\\  \\----.   |  |      |  `----./  _____  \\   |  |     |  | |  |\\   | |  |__| | |__| \n    |__|     |__|  |__| /__/     \\__\\ |__| \\__| |__|\\__\\ |_______/       |__|      \\______/  | _| `._____|   | _|      |_______/__/     \\__\\  |__|     |__| |__| \\__|  \\______| (__) \n                                                                                                                                                                                     "
                 );
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void GameLoop::startSingle(bool demoMode) {

    std::cout
            << "____    __    ____  _______  __        ______   ______   .___  ___.  _______    .___________.  ______      .______       __       _______. __  ___  __  \n"
               "\\   \\  /  \\  /   / |   ____||  |      /      | /  __  \\  |   \\/   | |   ____|   |           | /  __  \\     |   _  \\     |  |     /       ||  |/  / |  | \n"
               " \\   \\/    \\/   /  |  |__   |  |     |  ,----'|  |  |  | |  \\  /  | |  |__      `---|  |----`|  |  |  |    |  |_)  |    |  |    |   (----`|  '  /  |  | \n"
               "  \\            /   |   __|  |  |     |  |     |  |  |  | |  |\\/|  | |   __|         |  |     |  |  |  |    |      /     |  |     \\   \\    |    <   |  | \n"
               "   \\    /\\    /    |  |____ |  `----.|  `----.|  `--'  | |  |  |  | |  |____        |  |     |  `--'  |    |  |\\  \\----.|  | .----)   |   |  .  \\  |__| \n"
               "    \\__/  \\__/     |_______||_______| \\______| \\______/  |__|  |__| |_______|       |__|      \\______/     | _| `._____||__| |_______/    |__|\\__\\ (__) \n"
               "                                                                                                                                                        \n\n";

    std::string mapToLoad;
    int numberOfPlayers;
    Map* gameMap;
    do {
        mapToLoad = chooseMap();
        numberOfPlayers = choosePlayerNumber(2, 6);
        MapLoader myLoader = MapLoader(mapToLoad);
        gameMap = myLoader.readMapFile();

        if (gameMap == nullptr) {
            AlternativeLoader altLoader = AlternativeLoader(mapToLoad);
            gameMap = altLoader.altReadMapFile();
        }
        if (gameMap == nullptr || !gameMap->testConnected()) {
            cout << "There was an error loading the game board. Try another mapfile.\n";
            continue;
        } else if (int(gameMap->getMapCountries()->size()) < numberOfPlayers) {
            std::cout << "The selected map with " << gameMap->getMapCountries()->size() << " cannot support "
                      << numberOfPlayers << " players. Please try again." << std::endl;
        } else {
            break;
        }
    } while (true);

    std::vector<Player*>* gamePlayers = initPlayers(numberOfPlayers, gameMap);
    Deck* gameDeck = new Deck(gameMap->getMapCountries()->size());
    gameDeck->createDeck();
    gameMap->printMap();

    GameLoop::initInstance(gameMap, gamePlayers, gameDeck);

    if (!demoMode) {
        GameLoop::getInstance()->distributeArmies();
        GameLoop::getInstance()->loop();
        GameLoop::resetInstance();
    }

    std::cout << "\n"
                 ".___________. __    __       ___      .__   __.  __  ___      _______.    _______   ______   .______         .______    __          ___   ____    ____  __  .__   __.   _______  __  \n"
                 "|           ||  |  |  |     /   \\     |  \\ |  | |  |/  /     /       |   |   ____| /  __  \\  |   _  \\        |   _  \\  |  |        /   \\  \\   \\  /   / |  | |  \\ |  |  /  _____||  | \n"
                 "`---|  |----`|  |__|  |    /  ^  \\    |   \\|  | |  '  /     |   (----`   |  |__   |  |  |  | |  |_)  |       |  |_)  | |  |       /  ^  \\  \\   \\/   /  |  | |   \\|  | |  |  __  |  | \n"
                 "    |  |     |   __   |   /  /_\\  \\   |  . `  | |    <       \\   \\       |   __|  |  |  |  | |      /        |   ___/  |  |      /  /_\\  \\  \\_    _/   |  | |  . `  | |  | |_ | |  | \n"
                 "    |  |     |  |  |  |  /  _____  \\  |  |\\   | |  .  \\  .----)   |      |  |     |  `--'  | |  |\\  \\----.   |  |      |  `----./  _____  \\   |  |     |  | |  |\\   | |  |__| | |__| \n"
                 "    |__|     |__|  |__| /__/     \\__\\ |__| \\__| |__|\\__\\ |_______/       |__|      \\______/  | _| `._____|   | _|      |_______/__/     \\__\\  |__|     |__| |__| \\__|  \\______| (__) \n"
                 "                                                                                                                                                                                     ";
}